

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

void TorControlConnection::readcb(bufferevent *bev,void *ctx)

{
  _Storage<int,_true> *__args_1;
  long lVar1;
  function<void_(TorControlConnection_&,_const_TorControlReply_&)> *this;
  bool bVar2;
  _Storage<int,_true> _Var3;
  long lVar4;
  void *__ptr;
  optional<int> oVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  size_t n_read_out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string s;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = bufferevent_get_input();
  n_read_out = 0;
  if (lVar4 == 0) {
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
                  ,0x59,"static void TorControlConnection::readcb(struct bufferevent *, void *)");
  }
  __args_1 = (_Storage<int,_true> *)((long)ctx + 0x50);
  while( true ) {
    __ptr = (void *)evbuffer_readln(lVar4,&n_read_out,1);
    if (__ptr == (void *)0x0) break;
    s._M_dataplus._M_p = (pointer)&s.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&s,__ptr,n_read_out + (long)__ptr);
    free(__ptr);
    if (3 < s._M_string_length) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_78,&s,0,3);
      str._M_str = local_78._M_dataplus._M_p;
      str._M_len = local_78._M_string_length;
      oVar5 = ToIntegral<int>(str);
      _Var3._M_value =
           oVar5.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      if (((ulong)oVar5.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
        _Var3._M_value = 0;
      }
      __args_1->_M_value = (int)_Var3;
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_78,&s,4,0xffffffffffffffff);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 ((long)ctx + 0x58),&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      if (s._M_dataplus._M_p[3] == ' ') {
        if (__args_1->_M_value < 600) {
          this = *(function<void_(TorControlConnection_&,_const_TorControlReply_&)> **)
                  ((long)ctx + 0x80);
          if (*(function<void_(TorControlConnection_&,_const_TorControlReply_&)> **)
               ((long)ctx + 0xa0) == this) {
            bVar2 = ::LogAcceptCategory((LogFlags)this,(Level)ctx);
            if (bVar2) {
              logging_function._M_str = "readcb";
              logging_function._M_len = 6;
              source_file._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
              ;
              source_file._M_len = 0x5e;
              LogPrintFormatInternal<int>
                        (logging_function,source_file,0x71,TOR,Debug,
                         (ConstevalFormatString<1U>)0x6c0229,&__args_1->_M_value);
            }
          }
          else {
            std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>::operator()
                      (this,(TorControlConnection *)ctx,(TorControlReply *)__args_1);
            std::
            deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
            ::pop_front((deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
                         *)((long)ctx + 0x70));
          }
        }
        TorControlReply::Clear((TorControlReply *)__args_1);
      }
    }
    std::__cxx11::string::~string((string *)&s);
  }
  uVar6 = evbuffer_get_length(lVar4);
  if (100000 < uVar6) {
    logging_function_00._M_str = "readcb";
    logging_function_00._M_len = 6;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file_00._M_len = 0x5e;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0x7b,ALL,Info,(ConstevalFormatString<0U>)0x6c024c)
    ;
    Disconnect((TorControlConnection *)ctx);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TorControlConnection::readcb(struct bufferevent *bev, void *ctx)
{
    TorControlConnection *self = static_cast<TorControlConnection*>(ctx);
    struct evbuffer *input = bufferevent_get_input(bev);
    size_t n_read_out = 0;
    char *line;
    assert(input);
    //  If there is not a whole line to read, evbuffer_readln returns nullptr
    while((line = evbuffer_readln(input, &n_read_out, EVBUFFER_EOL_CRLF)) != nullptr)
    {
        std::string s(line, n_read_out);
        free(line);
        if (s.size() < 4) // Short line
            continue;
        // <status>(-|+| )<data><CRLF>
        self->message.code = ToIntegral<int>(s.substr(0, 3)).value_or(0);
        self->message.lines.push_back(s.substr(4));
        char ch = s[3]; // '-','+' or ' '
        if (ch == ' ') {
            // Final line, dispatch reply and clean up
            if (self->message.code >= 600) {
                // (currently unused)
                // Dispatch async notifications to async handler
                // Synchronous and asynchronous messages are never interleaved
            } else {
                if (!self->reply_handlers.empty()) {
                    // Invoke reply handler with message
                    self->reply_handlers.front()(*self, self->message);
                    self->reply_handlers.pop_front();
                } else {
                    LogDebug(BCLog::TOR, "Received unexpected sync reply %i\n", self->message.code);
                }
            }
            self->message.Clear();
        }
    }
    //  Check for size of buffer - protect against memory exhaustion with very long lines
    //  Do this after evbuffer_readln to make sure all full lines have been
    //  removed from the buffer. Everything left is an incomplete line.
    if (evbuffer_get_length(input) > MAX_LINE_LENGTH) {
        LogPrintf("tor: Disconnecting because MAX_LINE_LENGTH exceeded\n");
        self->Disconnect();
    }
}